

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qxmlstream.cpp
# Opt level: O0

bool __thiscall QXmlStreamReader::readNextStartElement(QXmlStreamReader *this)

{
  bool bVar1;
  TokenType TVar2;
  QXmlStreamReader *in_stack_00000030;
  
  while( true ) {
    TVar2 = readNext(in_stack_00000030);
    if (TVar2 == Invalid) {
      return false;
    }
    bVar1 = isEndElement((QXmlStreamReader *)0x6478ad);
    if ((bVar1) || (bVar1 = isEndDocument((QXmlStreamReader *)0x6478ba), bVar1)) break;
    bVar1 = isStartElement((QXmlStreamReader *)0x6478d0);
    if (bVar1) {
      return true;
    }
  }
  return false;
}

Assistant:

bool QXmlStreamReader::readNextStartElement()
{
    while (readNext() != Invalid) {
        if (isEndElement() || isEndDocument())
            return false;
        else if (isStartElement())
            return true;
    }
    return false;
}